

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

char * getobjname(Proto *p,int lastpc,int reg,char **name)

{
  uint i;
  long lVar1;
  int pc;
  undefined8 in_RAX;
  char *pcVar2;
  long *plVar3;
  int isup;
  ulong uVar4;
  int local_28;
  int local_24;
  
  _local_28 = CONCAT44((int)((ulong)in_RAX >> 0x20),lastpc);
  pcVar2 = basicgetobjname(p,&local_28,reg,name);
  if (pcVar2 != (char *)0x0) {
    return pcVar2;
  }
  pc = local_28;
  if ((long)local_28 == -1) {
    return (char *)0x0;
  }
  i = p->code[local_28];
  pcVar2 = (char *)0x0;
  switch(i & 0x7f) {
  case 0xb:
    uVar4 = (ulong)(i >> 0x14 & 0xfffffff0);
    if (((&p->k->tt_)[uVar4] & 0xf) == 4) {
      lVar1 = *(long *)((long)&p->k->value_ + uVar4);
      plVar3 = (long *)(lVar1 + 0x18);
      if (*(char *)(lVar1 + 0xb) < '\0') {
        plVar3 = (long *)*plVar3;
      }
    }
    else {
      plVar3 = (long *)0x12c9de;
    }
    *name = (char *)plVar3;
    isup = 1;
    goto LAB_0010ae48;
  case 0xc:
    _local_28 = CONCAT44(local_28,local_28);
    pcVar2 = basicgetobjname(p,&local_24,i >> 0x18,name);
    if ((pcVar2 == (char *)0x0) || (*pcVar2 != 'c')) {
LAB_0010adeb:
      plVar3 = (long *)0x12c9de;
      goto LAB_0010adf2;
    }
    goto LAB_0010adf5;
  case 0xd:
    *name = "integer index";
    pcVar2 = "field";
    break;
  case 0xe:
    uVar4 = (ulong)(i >> 0x14 & 0xfffffff0);
    if (((&p->k->tt_)[uVar4] & 0xf) != 4) goto LAB_0010adeb;
    lVar1 = *(long *)((long)&p->k->value_ + uVar4);
    plVar3 = (long *)(lVar1 + 0x18);
    if (*(char *)(lVar1 + 0xb) < '\0') {
      plVar3 = (long *)*plVar3;
    }
LAB_0010adf2:
    *name = (char *)plVar3;
LAB_0010adf5:
    isup = 0;
LAB_0010ae48:
    pcVar2 = isEnv(p,pc,i,isup);
    return pcVar2;
  case 0x14:
    uVar4 = (ulong)(i >> 0x14 & 0xfffffff0);
    if (((&p->k->tt_)[uVar4] & 0xf) == 4) {
      lVar1 = *(long *)((long)&p->k->value_ + uVar4);
      plVar3 = (long *)(lVar1 + 0x18);
      if (*(char *)(lVar1 + 0xb) < '\0') {
        plVar3 = (long *)*plVar3;
      }
    }
    else {
      plVar3 = (long *)0x12c9de;
    }
    *name = (char *)plVar3;
    pcVar2 = "method";
  }
  return pcVar2;
}

Assistant:

static const char *getobjname (const Proto *p, int lastpc, int reg,
                               const char **name) {
  const char *kind = basicgetobjname(p, &lastpc, reg, name);
  if (kind != NULL)
    return kind;
  else if (lastpc != -1) {  /* could find instruction? */
    Instruction i = p->code[lastpc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_GETTABUP: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return isEnv(p, lastpc, i, 1);
      }
      case OP_GETTABLE: {
        int k = GETARG_C(i);  /* key index */
        rname(p, lastpc, k, name);
        return isEnv(p, lastpc, i, 0);
      }
      case OP_GETI: {
        *name = "integer index";
        return "field";
      }
      case OP_GETFIELD: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return isEnv(p, lastpc, i, 0);
      }
      case OP_SELF: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return "method";
      }
      default: break;  /* go through to return NULL */
    }
  }
  return NULL;  /* could not find reasonable name */
}